

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar.c
# Opt level: O0

int memory_read(mtar_t *tar,void *data,size_t size)

{
  char *memory;
  size_t size_local;
  void *data_local;
  mtar_t *tar_local;
  
  if (size == 0) {
    tar_local._4_4_ = 0;
  }
  else if (tar->memory_size < tar->memory_pos + size) {
    tar_local._4_4_ = -3;
  }
  else {
    memcpy(data,(void *)((long)tar->stream + tar->memory_pos),size);
    tar->memory_pos = size + tar->memory_pos;
    tar_local._4_4_ = 0;
  }
  return tar_local._4_4_;
}

Assistant:

static int memory_read(mtar_t *tar, void *data, size_t size) {
  char *memory;

  if (!size)
    return MTAR_ESUCCESS;

  memory = (char *)tar->stream;
  if (tar->memory_pos + size > tar->memory_size)
    return MTAR_EREADFAIL;

  memcpy(data, &memory[tar->memory_pos], size);
  tar->memory_pos += size;

  return MTAR_ESUCCESS;
}